

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O0

ProgramResourceUsage *
deqp::gles31::Functional::getCombinedProgramResourceUsage
          (ProgramResourceUsage *__return_storage_ptr__,Program *program)

{
  Shader *shader_00;
  int iVar1;
  int iVar2;
  ShaderType SVar3;
  deUint32 dVar4;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
  *pvVar5;
  size_type sVar6;
  const_reference ppSVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  Shader *shader;
  int local_20;
  int shaderNdx;
  int numFragmentInputVectors;
  int numVertexOutputVectors;
  int numFragmentInputComponents;
  int numVertexOutputComponents;
  Program *program_local;
  
  numVertexOutputVectors = 0;
  numFragmentInputVectors = 0;
  shaderNdx = 0;
  local_20 = 0;
  __return_storage_ptr__->uniformBufferMaxBinding = -1;
  __return_storage_ptr__->uniformBufferMaxSize = 0;
  __return_storage_ptr__->numUniformBlocks = 0;
  __return_storage_ptr__->numCombinedVertexUniformComponents = 0;
  __return_storage_ptr__->numCombinedFragmentUniformComponents = 0;
  __return_storage_ptr__->numCombinedGeometryUniformComponents = 0;
  __return_storage_ptr__->numCombinedTessControlUniformComponents = 0;
  __return_storage_ptr__->numCombinedTessEvalUniformComponents = 0;
  __return_storage_ptr__->shaderStorageBufferMaxBinding = -1;
  __return_storage_ptr__->shaderStorageBufferMaxSize = 0;
  __return_storage_ptr__->numShaderStorageBlocks = 0;
  __return_storage_ptr__->numVaryingComponents = 0;
  __return_storage_ptr__->numVaryingVectors = 0;
  __return_storage_ptr__->numCombinedSamplers = 0;
  __return_storage_ptr__->atomicCounterBufferMaxBinding = -1;
  __return_storage_ptr__->atomicCounterBufferMaxSize = 0;
  __return_storage_ptr__->numAtomicCounterBuffers = 0;
  __return_storage_ptr__->numAtomicCounters = 0;
  __return_storage_ptr__->maxImageBinding = -1;
  __return_storage_ptr__->numCombinedImages = 0;
  __return_storage_ptr__->numCombinedOutputResources = 0;
  __return_storage_ptr__->numXFBInterleavedComponents = 0;
  __return_storage_ptr__->numXFBSeparateAttribs = 0;
  __return_storage_ptr__->numXFBSeparateComponents = 0;
  __return_storage_ptr__->fragmentOutputMaxBinding = -1;
  shader._4_4_ = 0;
  while( true ) {
    pvVar5 = ProgramInterfaceDefinition::Program::getShaders(program);
    sVar6 = std::
            vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
            ::size(pvVar5);
    if ((int)sVar6 <= shader._4_4_) break;
    pvVar5 = ProgramInterfaceDefinition::Program::getShaders(program);
    ppSVar7 = std::
              vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
              ::operator[](pvVar5,(long)shader._4_4_);
    shader_00 = *ppSVar7;
    iVar2 = __return_storage_ptr__->uniformBufferMaxBinding;
    iVar1 = anon_unknown_3::getMaxBufferBinding(shader_00,STORAGE_UNIFORM);
    iVar2 = de::max<int>(iVar2,iVar1);
    __return_storage_ptr__->uniformBufferMaxBinding = iVar2;
    iVar2 = __return_storage_ptr__->uniformBufferMaxSize;
    iVar1 = anon_unknown_3::getBufferMaxSize(shader_00,STORAGE_UNIFORM);
    iVar2 = de::max<int>(iVar2,iVar1);
    __return_storage_ptr__->uniformBufferMaxSize = iVar2;
    iVar2 = anon_unknown_3::getNumShaderBlocks(shader_00,STORAGE_UNIFORM);
    __return_storage_ptr__->numUniformBlocks = __return_storage_ptr__->numUniformBlocks + iVar2;
    SVar3 = ProgramInterfaceDefinition::Shader::getType(shader_00);
    switch(SVar3) {
    case SHADERTYPE_VERTEX:
      iVar2 = anon_unknown_3::getNumComponents(shader_00,STORAGE_UNIFORM);
      __return_storage_ptr__->numCombinedVertexUniformComponents =
           iVar2 + __return_storage_ptr__->numCombinedVertexUniformComponents;
      break;
    case SHADERTYPE_FRAGMENT:
      iVar2 = anon_unknown_3::getNumComponents(shader_00,STORAGE_UNIFORM);
      __return_storage_ptr__->numCombinedFragmentUniformComponents =
           iVar2 + __return_storage_ptr__->numCombinedFragmentUniformComponents;
      break;
    case SHADERTYPE_GEOMETRY:
      iVar2 = anon_unknown_3::getNumComponents(shader_00,STORAGE_UNIFORM);
      __return_storage_ptr__->numCombinedGeometryUniformComponents =
           iVar2 + __return_storage_ptr__->numCombinedGeometryUniformComponents;
      break;
    case SHADERTYPE_TESSELLATION_CONTROL:
      iVar2 = anon_unknown_3::getNumComponents(shader_00,STORAGE_UNIFORM);
      __return_storage_ptr__->numCombinedTessControlUniformComponents =
           iVar2 + __return_storage_ptr__->numCombinedTessControlUniformComponents;
      break;
    case SHADERTYPE_TESSELLATION_EVALUATION:
      iVar2 = anon_unknown_3::getNumComponents(shader_00,STORAGE_UNIFORM);
      __return_storage_ptr__->numCombinedTessEvalUniformComponents =
           iVar2 + __return_storage_ptr__->numCombinedTessEvalUniformComponents;
    }
    iVar2 = __return_storage_ptr__->shaderStorageBufferMaxBinding;
    iVar1 = anon_unknown_3::getMaxBufferBinding(shader_00,STORAGE_BUFFER);
    iVar2 = de::max<int>(iVar2,iVar1);
    __return_storage_ptr__->shaderStorageBufferMaxBinding = iVar2;
    iVar2 = __return_storage_ptr__->shaderStorageBufferMaxSize;
    iVar1 = anon_unknown_3::getBufferMaxSize(shader_00,STORAGE_BUFFER);
    iVar2 = de::max<int>(iVar2,iVar1);
    __return_storage_ptr__->shaderStorageBufferMaxSize = iVar2;
    iVar2 = anon_unknown_3::getNumShaderBlocks(shader_00,STORAGE_BUFFER);
    __return_storage_ptr__->numShaderStorageBlocks =
         iVar2 + __return_storage_ptr__->numShaderStorageBlocks;
    SVar3 = ProgramInterfaceDefinition::Shader::getType(shader_00);
    if (SVar3 == SHADERTYPE_VERTEX) {
      iVar2 = anon_unknown_3::getNumComponents(shader_00,STORAGE_OUT);
      numVertexOutputVectors = iVar2 + numVertexOutputVectors;
      iVar2 = anon_unknown_3::getNumVectors(shader_00,STORAGE_OUT);
      shaderNdx = iVar2 + shaderNdx;
    }
    else {
      SVar3 = ProgramInterfaceDefinition::Shader::getType(shader_00);
      if (SVar3 == SHADERTYPE_FRAGMENT) {
        iVar2 = anon_unknown_3::getNumComponents(shader_00,STORAGE_IN);
        numFragmentInputVectors = iVar2 + numFragmentInputVectors;
        iVar2 = anon_unknown_3::getNumVectors(shader_00,STORAGE_IN);
        local_20 = iVar2 + local_20;
      }
    }
    iVar2 = anon_unknown_3::getNumTypeInstances(shader_00,STORAGE_UNIFORM,glu::isDataTypeSampler);
    __return_storage_ptr__->numCombinedSamplers =
         iVar2 + __return_storage_ptr__->numCombinedSamplers;
    iVar2 = __return_storage_ptr__->atomicCounterBufferMaxBinding;
    iVar1 = anon_unknown_3::getAtomicCounterMaxBinding(shader_00);
    iVar2 = de::max<int>(iVar2,iVar1);
    __return_storage_ptr__->atomicCounterBufferMaxBinding = iVar2;
    iVar2 = __return_storage_ptr__->atomicCounterBufferMaxSize;
    iVar1 = anon_unknown_3::getAtomicCounterMaxBufferSize(shader_00);
    iVar2 = de::max<int>(iVar2,iVar1);
    __return_storage_ptr__->atomicCounterBufferMaxSize = iVar2;
    iVar2 = anon_unknown_3::getNumAtomicCounterBuffers(shader_00);
    __return_storage_ptr__->numAtomicCounterBuffers =
         iVar2 + __return_storage_ptr__->numAtomicCounterBuffers;
    iVar2 = anon_unknown_3::getNumTypeInstances
                      (shader_00,STORAGE_UNIFORM,glu::isDataTypeAtomicCounter);
    __return_storage_ptr__->numAtomicCounters = iVar2 + __return_storage_ptr__->numAtomicCounters;
    iVar2 = __return_storage_ptr__->maxImageBinding;
    iVar1 = anon_unknown_3::getUniformMaxBinding(shader_00,glu::isDataTypeImage);
    iVar2 = de::max<int>(iVar2,iVar1);
    __return_storage_ptr__->maxImageBinding = iVar2;
    iVar2 = anon_unknown_3::getNumTypeInstances(shader_00,STORAGE_UNIFORM,glu::isDataTypeImage);
    __return_storage_ptr__->numCombinedImages = iVar2 + __return_storage_ptr__->numCombinedImages;
    iVar2 = anon_unknown_3::getNumTypeInstances(shader_00,STORAGE_UNIFORM,glu::isDataTypeImage);
    __return_storage_ptr__->numCombinedOutputResources =
         iVar2 + __return_storage_ptr__->numCombinedOutputResources;
    iVar2 = anon_unknown_3::getNumShaderBlocks(shader_00,STORAGE_BUFFER);
    __return_storage_ptr__->numCombinedOutputResources =
         iVar2 + __return_storage_ptr__->numCombinedOutputResources;
    SVar3 = ProgramInterfaceDefinition::Shader::getType(shader_00);
    if (SVar3 == SHADERTYPE_FRAGMENT) {
      iVar2 = anon_unknown_3::getNumVectors(shader_00,STORAGE_OUT);
      __return_storage_ptr__->numCombinedOutputResources =
           iVar2 + __return_storage_ptr__->numCombinedOutputResources;
      iVar2 = __return_storage_ptr__->fragmentOutputMaxBinding;
      iVar1 = anon_unknown_3::getFragmentOutputMaxLocation(shader_00);
      iVar2 = de::max<int>(iVar2,iVar1);
      __return_storage_ptr__->fragmentOutputMaxBinding = iVar2;
    }
    shader._4_4_ = shader._4_4_ + 1;
  }
  dVar4 = ProgramInterfaceDefinition::Program::getTransformFeedbackMode(program);
  if (dVar4 == 0x8c8c) {
    iVar2 = anon_unknown_3::getNumXFBComponents(program);
    __return_storage_ptr__->numXFBInterleavedComponents = iVar2;
  }
  else {
    dVar4 = ProgramInterfaceDefinition::Program::getTransformFeedbackMode(program);
    if (dVar4 == 0x8c8d) {
      this = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_(program);
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(this);
      __return_storage_ptr__->numXFBSeparateAttribs = (int)sVar6;
      iVar2 = anon_unknown_3::getNumMaxXFBOutputComponents(program);
      __return_storage_ptr__->numXFBSeparateComponents = iVar2;
    }
  }
  iVar2 = de::max<int>(numVertexOutputVectors,numFragmentInputVectors);
  __return_storage_ptr__->numVaryingComponents = iVar2;
  iVar2 = de::max<int>(shaderNdx,local_20);
  __return_storage_ptr__->numVaryingVectors = iVar2;
  return __return_storage_ptr__;
}

Assistant:

ProgramInterfaceDefinition::ProgramResourceUsage getCombinedProgramResourceUsage (const ProgramInterfaceDefinition::Program* program)
{
	ProgramInterfaceDefinition::ProgramResourceUsage	retVal;
	int													numVertexOutputComponents	= 0;
	int													numFragmentInputComponents	= 0;
	int													numVertexOutputVectors		= 0;
	int													numFragmentInputVectors		= 0;

	retVal.uniformBufferMaxBinding					= -1; // max binding is inclusive upper bound. Allow 0 bindings by using negative value
	retVal.uniformBufferMaxSize						= 0;
	retVal.numUniformBlocks							= 0;
	retVal.numCombinedVertexUniformComponents		= 0;
	retVal.numCombinedFragmentUniformComponents		= 0;
	retVal.numCombinedGeometryUniformComponents		= 0;
	retVal.numCombinedTessControlUniformComponents	= 0;
	retVal.numCombinedTessEvalUniformComponents		= 0;
	retVal.shaderStorageBufferMaxBinding			= -1; // see above
	retVal.shaderStorageBufferMaxSize				= 0;
	retVal.numShaderStorageBlocks					= 0;
	retVal.numVaryingComponents						= 0;
	retVal.numVaryingVectors						= 0;
	retVal.numCombinedSamplers						= 0;
	retVal.atomicCounterBufferMaxBinding			= -1; // see above
	retVal.atomicCounterBufferMaxSize				= 0;
	retVal.numAtomicCounterBuffers					= 0;
	retVal.numAtomicCounters						= 0;
	retVal.maxImageBinding							= -1; // see above
	retVal.numCombinedImages						= 0;
	retVal.numCombinedOutputResources				= 0;
	retVal.numXFBInterleavedComponents				= 0;
	retVal.numXFBSeparateAttribs					= 0;
	retVal.numXFBSeparateComponents					= 0;
	retVal.fragmentOutputMaxBinding					= -1; // see above

	for (int shaderNdx = 0; shaderNdx < (int)program->getShaders().size(); ++shaderNdx)
	{
		const ProgramInterfaceDefinition::Shader* const shader = program->getShaders()[shaderNdx];

		retVal.uniformBufferMaxBinding		= de::max(retVal.uniformBufferMaxBinding, getMaxBufferBinding(shader, glu::STORAGE_UNIFORM));
		retVal.uniformBufferMaxSize			= de::max(retVal.uniformBufferMaxSize, getBufferMaxSize(shader, glu::STORAGE_UNIFORM));
		retVal.numUniformBlocks				+= getNumShaderBlocks(shader, glu::STORAGE_UNIFORM);

		switch (shader->getType())
		{
			case glu::SHADERTYPE_VERTEX:					retVal.numCombinedVertexUniformComponents		+= getNumComponents(shader, glu::STORAGE_UNIFORM); break;
			case glu::SHADERTYPE_FRAGMENT:					retVal.numCombinedFragmentUniformComponents		+= getNumComponents(shader, glu::STORAGE_UNIFORM); break;
			case glu::SHADERTYPE_GEOMETRY:					retVal.numCombinedGeometryUniformComponents		+= getNumComponents(shader, glu::STORAGE_UNIFORM); break;
			case glu::SHADERTYPE_TESSELLATION_CONTROL:		retVal.numCombinedTessControlUniformComponents	+= getNumComponents(shader, glu::STORAGE_UNIFORM); break;
			case glu::SHADERTYPE_TESSELLATION_EVALUATION:	retVal.numCombinedTessEvalUniformComponents		+= getNumComponents(shader, glu::STORAGE_UNIFORM); break;
			default: break;
		}

		retVal.shaderStorageBufferMaxBinding	= de::max(retVal.shaderStorageBufferMaxBinding, getMaxBufferBinding(shader, glu::STORAGE_BUFFER));
		retVal.shaderStorageBufferMaxSize		= de::max(retVal.shaderStorageBufferMaxSize, getBufferMaxSize(shader, glu::STORAGE_BUFFER));
		retVal.numShaderStorageBlocks			+= getNumShaderBlocks(shader, glu::STORAGE_BUFFER);

		if (shader->getType() == glu::SHADERTYPE_VERTEX)
		{
			numVertexOutputComponents	+= getNumComponents(shader, glu::STORAGE_OUT);
			numVertexOutputVectors		+= getNumVectors(shader, glu::STORAGE_OUT);
		}
		else if (shader->getType() == glu::SHADERTYPE_FRAGMENT)
		{
			numFragmentInputComponents	+= getNumComponents(shader, glu::STORAGE_IN);
			numFragmentInputVectors		+= getNumVectors(shader, glu::STORAGE_IN);
		}

		retVal.numCombinedSamplers	+= getNumTypeInstances(shader, glu::STORAGE_UNIFORM, glu::isDataTypeSampler);

		retVal.atomicCounterBufferMaxBinding	= de::max(retVal.atomicCounterBufferMaxBinding, getAtomicCounterMaxBinding(shader));
		retVal.atomicCounterBufferMaxSize		= de::max(retVal.atomicCounterBufferMaxSize, getAtomicCounterMaxBufferSize(shader));
		retVal.numAtomicCounterBuffers			+= getNumAtomicCounterBuffers(shader);
		retVal.numAtomicCounters				+= getNumTypeInstances(shader, glu::STORAGE_UNIFORM, glu::isDataTypeAtomicCounter);
		retVal.maxImageBinding					= de::max(retVal.maxImageBinding, getUniformMaxBinding(shader, glu::isDataTypeImage));
		retVal.numCombinedImages				+= getNumTypeInstances(shader, glu::STORAGE_UNIFORM, glu::isDataTypeImage);

		retVal.numCombinedOutputResources		+= getNumTypeInstances(shader, glu::STORAGE_UNIFORM, glu::isDataTypeImage);
		retVal.numCombinedOutputResources		+= getNumShaderBlocks(shader, glu::STORAGE_BUFFER);

		if (shader->getType() == glu::SHADERTYPE_FRAGMENT)
		{
			retVal.numCombinedOutputResources += getNumVectors(shader, glu::STORAGE_OUT);
			retVal.fragmentOutputMaxBinding = de::max(retVal.fragmentOutputMaxBinding, getFragmentOutputMaxLocation(shader));
		}
	}

	if (program->getTransformFeedbackMode() == GL_INTERLEAVED_ATTRIBS)
		retVal.numXFBInterleavedComponents = getNumXFBComponents(program);
	else if (program->getTransformFeedbackMode() == GL_SEPARATE_ATTRIBS)
	{
		retVal.numXFBSeparateAttribs	= (int)program->getTransformFeedbackVaryings().size();
		retVal.numXFBSeparateComponents	= getNumMaxXFBOutputComponents(program);
	}

	// legacy limits
	retVal.numVaryingComponents	= de::max(numVertexOutputComponents, numFragmentInputComponents);
	retVal.numVaryingVectors	= de::max(numVertexOutputVectors, numFragmentInputVectors);

	return retVal;
}